

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr,REF_GRID ref_grid)

{
  REF_EDGE pRVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_EDGE ref_edge;
  REF_GRID ref_grid_local;
  REF_EDGE *ref_edge_ptr_local;
  
  pRVar1 = (REF_EDGE)malloc(0x20);
  *ref_edge_ptr = pRVar1;
  if (*ref_edge_ptr == (REF_EDGE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x45,
           "ref_edge_create","malloc *ref_edge_ptr of REF_EDGE_STRUCT NULL");
    ref_edge_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_edge_ptr;
    pRVar1->n = 0;
    pRVar1->max = 0;
    pRVar1->e2n = (REF_INT *)0x0;
    ref_edge_ptr_local._4_4_ = ref_adj_create(&pRVar1->adj);
    if (ref_edge_ptr_local._4_4_ == 0) {
      pRVar1->node = ref_grid->node;
      ref_edge_ptr_local._4_4_ = ref_edge_builder_uniq(pRVar1,ref_grid);
      if (ref_edge_ptr_local._4_4_ == 0) {
        ref_edge_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x51
               ,"ref_edge_create",(ulong)ref_edge_ptr_local._4_4_,"build edges");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x4d,
             "ref_edge_create",(ulong)ref_edge_ptr_local._4_4_,"create adj");
    }
  }
  return ref_edge_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr, REF_GRID ref_grid) {
  REF_EDGE ref_edge;

  ref_malloc(*ref_edge_ptr, 1, REF_EDGE_STRUCT);

  ref_edge = *ref_edge_ptr;

  ref_edge_n(ref_edge) = 0;
  ref_edge_max(ref_edge) = 0;
  ref_edge->e2n = (REF_INT *)NULL;

  RSS(ref_adj_create(&(ref_edge_adj(ref_edge))), "create adj");

  ref_edge_node(ref_edge) = ref_grid_node(ref_grid);

  RSS(ref_edge_builder_uniq(ref_edge, ref_grid), "build edges");

  return REF_SUCCESS;
}